

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_sampler_skip.cpp
# Opt level: O1

void KokkosTools::Sampler::kokkosp_end_parallel_scan(uint64_t kID)

{
  long *plVar1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  ulong in_RDI;
  __hash_code __code;
  long *plVar5;
  long *plVar6;
  key_type local_18;
  
  if (endScanCallee != (code *)0x0) {
    plVar5 = *(long **)(infokIDSample + (in_RDI % DAT_00108218) * 8);
    plVar6 = (long *)0x0;
    if ((plVar5 != (long *)0x0) &&
       (plVar1 = (long *)*plVar5, plVar6 = plVar5, ((long *)*plVar5)[1] != in_RDI)) {
      while (plVar5 = plVar1, plVar1 = (long *)*plVar5, plVar1 != (long *)0x0) {
        plVar6 = (long *)0x0;
        if (((ulong)plVar1[1] % DAT_00108218 != in_RDI % DAT_00108218) ||
           (plVar6 = plVar5, plVar1[1] == in_RDI)) goto LAB_0010421a;
      }
      plVar6 = (long *)0x0;
    }
LAB_0010421a:
    if ((plVar6 != (long *)0x0) && (*plVar6 != 0)) {
      pmVar3 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&infokIDSample,&local_18);
      mVar2 = *pmVar3;
      if (0 < tool_verbosity) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"KokkosP: sample ",0x10);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," calling child-end function...\n",0x1f);
      }
      if (tool_globFence != 0) {
        invoke_ktools_fence(0);
      }
      (*endScanCallee)(mVar2);
      if (0 < tool_verbosity) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"KokkosP: sample ",0x10);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," finished with child-end function.\n",0x23);
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&infokIDSample,&local_18);
    }
  }
  return;
}

Assistant:

void kokkosp_end_parallel_scan(const uint64_t kID) {
  if (NULL != endScanCallee) {
    if (!(infokIDSample.find(kID) == infokIDSample.end())) {
      uint64_t retrievedNestedkID = infokIDSample[kID];
      if (tool_verbosity > 0) {
        std::cout << "KokkosP: sample " << kID
                  << " calling child-end function...\n";
      }
      if (tool_globFence) {
        invoke_ktools_fence(0);
      }
      (*endScanCallee)(retrievedNestedkID);
      if (tool_verbosity > 0) {
        std::cout << "KokkosP: sample " << kID
                  << " finished with child-end function.\n";
      }
      infokIDSample.erase(kID);
    }
  }
}